

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_map.hpp
# Opt level: O2

void __thiscall
duckdb::fixed_size_map_t<duckdb::list_entry_t>::fixed_size_map_t
          (fixed_size_map_t<duckdb::list_entry_t> *this,idx_t capacity_p)

{
  this->capacity = capacity_p;
  (this->occupied).validity_mask = (uchar *)0x0;
  (this->occupied).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->occupied).validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->occupied).capacity = 0x800;
  (this->values).
  super_unique_ptr<duckdb::list_entry_t[],_std::default_delete<duckdb::list_entry_t[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::list_entry_t,_std::default_delete<duckdb::list_entry_t[]>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::list_entry_t_*,_std::default_delete<duckdb::list_entry_t[]>_>.
  super__Head_base<0UL,_duckdb::list_entry_t_*,_false>._M_head_impl = (list_entry_t *)0x0;
  resize(this,capacity_p);
  return;
}

Assistant:

explicit fixed_size_map_t(idx_t capacity_p = 0) : capacity(capacity_p) {
		resize(capacity);
	}